

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O1

bool __thiscall libcellml::Component::removeVariable(Component *this,size_t index)

{
  EntityImpl *pEVar1;
  size_type sVar2;
  Variable *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  VariableImpl *this_02;
  long lVar3;
  ulong uVar4;
  
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  sVar2 = pEVar1[6].mId._M_string_length;
  uVar4 = (long)(pEVar1[6].mId.field_2._M_allocated_capacity - sVar2) >> 4;
  if (index < uVar4) {
    lVar3 = index * 0x10;
    this_00 = *(Variable **)(sVar2 + lVar3);
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(sVar2 + 8 + lVar3);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
    pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             mPimpl;
    std::
    vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
    ::_M_erase((vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
                *)&pEVar1[6].mId._M_string_length,
               (shared_ptr<libcellml::Variable> *)(lVar3 + pEVar1[6].mId._M_string_length));
    this_02 = Variable::pFunc(this_00);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_02);
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  return index < uVar4;
}

Assistant:

bool Component::removeVariable(size_t index)
{
    if (index < pFunc()->mVariables.size()) {
        auto variable = pFunc()->mVariables[index];
        pFunc()->mVariables.erase(pFunc()->mVariables.begin() + ptrdiff_t(index));
        variable->pFunc()->removeParent();
        return true;
    }

    return false;
}